

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O2

int ffikls(fitsfile *fptr,char *keyname,char *value,char *comm,int *status)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int tstatus;
  char *local_1a8;
  fitsfile *local_1a0;
  char *local_198;
  char *local_190;
  char valstring [71];
  char card [81];
  char tstring [71];
  char local_89;
  char tmpkeyname [81];
  
  tstatus = -1;
  iVar9 = *status;
  if (iVar9 < 1) {
    local_1a0 = fptr;
    local_190 = comm;
    sVar3 = strlen(value);
    iVar9 = 0x44;
    pcVar4 = value;
    while (pcVar4 = strchr(pcVar4,0x27), pcVar4 != (char *)0x0) {
      pcVar4 = pcVar4 + 1;
      iVar9 = iVar9 + -1;
    }
    local_1a8 = keyname;
    local_198 = value;
    strncpy(tmpkeyname,keyname,0x50);
    tmpkeyname[0x50] = '\0';
    pcVar4 = &local_89;
    do {
      pcVar1 = pcVar4 + 1;
      pcVar4 = pcVar4 + 1;
    } while (*pcVar1 == ' ');
    sVar5 = strlen(pcVar4);
    if ((8 < (int)sVar5) || (iVar2 = fftkey(pcVar4,&tstatus), iVar11 = iVar9, 0 < iVar2)) {
      iVar11 = (iVar9 - (int)sVar5) + 7;
    }
    bVar7 = true;
    iVar2 = 0;
    while (iVar10 = (int)sVar3, 0 < iVar10) {
      if (0x46 < iVar11) {
        ffpmsg("longstr keyword value is too long (ffikls)");
        *status = 0xcf;
        return 0xcf;
      }
      strncpy(tstring,local_198 + iVar2,(long)iVar11);
      tstring[iVar11] = '\0';
      ffs2c(tstring,valstring,status);
      if (iVar11 < iVar10) {
        sVar3 = strlen(valstring);
        iVar11 = iVar11 + -1;
        lVar6 = sVar3 << 0x20;
        lVar8 = lVar6 + -0x200000000 >> 0x20;
        if (valstring[lVar8] == '\'') {
          valstring[lVar6 + -0x300000000 >> 0x20] = '&';
          valstring[lVar6 + -0x100000000 >> 0x20] = '\0';
        }
        else {
          valstring[lVar8] = '&';
        }
      }
      if (bVar7) {
        ffmkky(local_1a8,valstring,local_190,card,status);
      }
      else {
        ffmkky("CONTINUE",valstring,local_190,card,status);
        card[8] = ' ';
        card[9] = ' ';
      }
      ffikey(local_1a0,card,status);
      iVar2 = iVar2 + iVar11;
      bVar7 = false;
      sVar3 = (size_t)(uint)(iVar10 - iVar11);
      iVar11 = iVar9;
    }
    iVar9 = *status;
  }
  return iVar9;
}

Assistant:

int ffikls( fitsfile *fptr,           /* I - FITS file pointer        */
            const char *keyname,      /* I - name of keyword to write */
            const char *value,        /* I - keyword value            */
            const char *comm,         /* I - keyword comment          */
            int  *status)             /* IO - error status            */
/*
  Insert a long string keyword.  This routine supports the
  HEASARC long string convention and can insert arbitrarily long string
  keyword values.  The value is continued over multiple keywords that
  have the name COMTINUE without an equal sign in column 9 of the card.
  This routine also supports simple string keywords which are less than
  69 characters in length.
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD], tmpkeyname[FLEN_CARD];
    char tstring[FLEN_VALUE], *cptr;
    int next, remain, vlen, nquote, nchar, namelen, contin, tstatus = -1;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /*  construct the new keyword, and insert into header */
    remain = strlen(value);    /* number of characters to write out */
    next = 0;                  /* pointer to next character to write */
    
    /* count the number of single quote characters in the string */
    nquote = 0;
    cptr = strchr(value, '\'');   /* search for quote character */

    while (cptr)  /* search for quote character */
    {
        nquote++;            /*  increment no. of quote characters  */
        cptr++;              /*  increment pointer to next character */
        cptr = strchr(cptr, '\'');  /* search for another quote char */
    }


    strncpy(tmpkeyname, keyname, 80);
    tmpkeyname[80] = '\0';
    
    cptr = tmpkeyname;
    while(*cptr == ' ')   /* skip over leading spaces in name */
        cptr++;

    /* determine the number of characters that will fit on the line */
    /* Note: each quote character is expanded to 2 quotes */

    namelen = strlen(cptr);
    if (namelen <= 8 && (fftkey(cptr, &tstatus) <= 0) )
    {
        /* This a normal 8-character FITS keyword */
        nchar = 68 - nquote; /*  max of 68 chars fit in a FITS string value */
    }
    else
    {
	nchar = 80 - nquote - namelen - 5;
    }

    contin = 0;
    while (remain > 0)
    {
        if (nchar > FLEN_VALUE-1)
        {
           ffpmsg("longstr keyword value is too long (ffikls)");
           return (*status=BAD_KEYCHAR);
        }
        strncpy(tstring, &value[next], nchar); /* copy string to temp buff */
        tstring[nchar] = '\0';
        ffs2c(tstring, valstring, status);  /* put quotes around the string */

        if (remain > nchar)   /* if string is continued, put & as last char */
        {
            vlen = strlen(valstring);
            nchar -= 1;        /* outputting one less character now */

            if (valstring[vlen-2] != '\'')
                valstring[vlen-2] = '&';  /*  over write last char with &  */
            else
            { /* last char was a pair of single quotes, so over write both */
                valstring[vlen-3] = '&';
                valstring[vlen-1] = '\0';
            }
        }

        if (contin)           /* This is a CONTINUEd keyword */
        {
           ffmkky("CONTINUE", valstring, comm, card, status); /* make keyword */
           strncpy(&card[8], "   ",  2);  /* overwrite the '=' */
        }
        else
        {
           ffmkky(keyname, valstring, comm, card, status);  /* make keyword */
        }

        ffikey(fptr, card, status);  /* insert the keyword */
       
        contin = 1;
        remain -= nchar;
        next  += nchar;
        nchar = 68 - nquote;
    }
    return(*status);
}